

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluator.h
# Opt level: O0

bool __thiscall flexScore::operator>(flexScore *this,flexScore *b)

{
  flexScore *b_local;
  flexScore *this_local;
  
  if ((this->extreme & 1U) == 0) {
    if ((b->extreme & 1U) == 0) {
      if ((this->tethered & 1U) == 0) {
        if ((b->tethered & 1U) == 0) {
          this_local._7_1_ = b->score <= this->score && this->score != b->score;
        }
        else if ((b->draw & 1U) == 0) {
          this_local._7_1_ = (bool)((b->favorable ^ 0xffU) & 1);
        }
        else {
          this_local._7_1_ = true;
        }
      }
      else if ((this->draw & 1U) == 0) {
        if ((b->tethered & 1U) == 0) {
          this_local._7_1_ = (bool)(this->favorable & 1);
        }
        else if ((b->draw & 1U) == 0) {
          if ((this->favorable & 1U) == 0) {
            if ((b->favorable & 1U) == 0) {
              this_local._7_1_ = b->count < this->count;
            }
            else {
              this_local._7_1_ = false;
            }
          }
          else if ((b->favorable & 1U) == 0) {
            this_local._7_1_ = true;
          }
          else {
            this_local._7_1_ = this->count < b->count;
          }
        }
        else {
          this_local._7_1_ = (bool)(this->favorable & 1);
        }
      }
      else if ((b->tethered & 1U) == 0) {
        this_local._7_1_ = false;
      }
      else if ((b->draw & 1U) == 0) {
        this_local._7_1_ = (bool)((b->favorable ^ 0xffU) & 1);
      }
      else {
        this_local._7_1_ = b->count < this->count;
      }
    }
    else {
      this_local._7_1_ = (bool)((b->favorable ^ 0xffU) & 1);
    }
  }
  else if ((b->extreme & 1U) == 0) {
    this_local._7_1_ = (bool)(this->favorable & 1);
  }
  else if ((b->favorable & 1U) == 0) {
    this_local._7_1_ = (bool)(this->favorable & 1);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool operator>(const flexScore& b) { // There's probably a more readable way to do this...
    if(this->extreme) {
      if(b.extreme) {
        if(b.favorable) {
          return false;
        }
        return favorable;
      }
      return favorable;
    }
    if(b.extreme) {
      return !b.favorable;
    }
    if(this->tethered) {
      if(this->draw) {
        if(b.tethered) {
          if(b.draw) {
            return this->count > b.count;
          } else {
            return !b.favorable;
          }
        }
        return false;
      } else {
        if(b.tethered) {
          if(b.draw) {
            return this->favorable;
          } else {
            if(this->favorable) {
              if(b.favorable) {
                return this->count < b.count;
              }
              return true;
            } else {
              if(b.favorable) {
                return false;
              } else {
                return this->count > b.count;
              }
            }
          }
        } else {
          return this->favorable;
        }
      }
    } else {
      if(b.tethered) {
        if(b.draw) {
          return true;
        } else {
          return !b.favorable;
        }
      } else {
        return this->score > b.score;
      }
    }
    return false;
  }